

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_nodes.cpp
# Opt level: O1

shared_ptr<duckdb::BoundParameterData,_true> __thiscall
duckdb::BoundParameterData::Deserialize(BoundParameterData *this,Deserializer *deserializer)

{
  BoundParameterData *pBVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<duckdb::BoundParameterData,_true> sVar2;
  Value value;
  Value VStack_a8;
  Value local_68;
  
  (*deserializer->_vptr_Deserializer[2])(deserializer,100,"value");
  (*deserializer->_vptr_Deserializer[6])(deserializer);
  Value::Deserialize(&VStack_a8,deserializer);
  (*deserializer->_vptr_Deserializer[7])(deserializer);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  pBVar1 = (BoundParameterData *)operator_new(0x58);
  Value::Value(&local_68,&VStack_a8);
  BoundParameterData(pBVar1,&local_68);
  *(BoundParameterData **)&(this->value).type_ = pBVar1;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<duckdb::BoundParameterData*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&(this->value).type_.type_info_,pBVar1);
  Value::~Value(&local_68);
  pBVar1 = shared_ptr<duckdb::BoundParameterData,_true>::operator->
                     ((shared_ptr<duckdb::BoundParameterData,_true> *)this);
  Deserializer::ReadProperty<duckdb::LogicalType>
            (deserializer,0x65,"return_type",&pBVar1->return_type);
  Value::~Value(&VStack_a8);
  sVar2.internal.super___shared_ptr<duckdb::BoundParameterData,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  sVar2.internal.super___shared_ptr<duckdb::BoundParameterData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       this;
  return (shared_ptr<duckdb::BoundParameterData,_true>)
         sVar2.internal.super___shared_ptr<duckdb::BoundParameterData,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<BoundParameterData> BoundParameterData::Deserialize(Deserializer &deserializer) {
	auto value = deserializer.ReadProperty<Value>(100, "value");
	auto result = duckdb::shared_ptr<BoundParameterData>(new BoundParameterData(value));
	deserializer.ReadProperty<LogicalType>(101, "return_type", result->return_type);
	return result;
}